

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

bool ghc::filesystem::create_directories(path *p,error_code *ec)

{
  bool bVar1;
  file_type fVar2;
  reference this;
  error_code eVar3;
  bool local_189;
  undefined4 uStack_184;
  file_status local_178;
  undefined1 local_170 [8];
  error_code tmp_ec;
  file_status local_158;
  file_status fs;
  error_code tec;
  path local_138;
  path local_118;
  undefined1 local_f8 [8];
  string_type part;
  undefined1 local_d0 [8];
  iterator __end2;
  iterator __begin2;
  path *__range2;
  undefined1 local_40 [7];
  bool didCreate;
  path current;
  error_code *ec_local;
  path *p_local;
  
  current._path.field_2._8_8_ = ec;
  path::path((path *)local_40);
  std::error_code::clear((error_code *)current._path.field_2._8_8_);
  __range2._7_1_ = 0;
  path::begin((iterator *)((long)&__end2._current._path.field_2 + 8),p);
  path::end((iterator *)local_d0,p);
  while (bVar1 = path::iterator::operator!=
                           ((iterator *)((long)&__end2._current._path.field_2 + 8),
                            (iterator *)local_d0), bVar1) {
    this = path::iterator::operator*((iterator *)((long)&__end2._current._path.field_2 + 8));
    path::operator_cast_to_string((string_type *)local_f8,this);
    path::operator/=((path *)local_40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    path::root_name(&local_118,p);
    bVar1 = operator!=((path *)local_40,&local_118);
    local_189 = false;
    if (bVar1) {
      path::root_path(&local_138,p);
      local_189 = operator!=((path *)local_40,&local_138);
      path::~path(&local_138);
    }
    path::~path(&local_118);
    if (local_189 == false) {
LAB_001a9be0:
      part.field_2._12_4_ = 0;
    }
    else {
      std::error_code::error_code((error_code *)&fs);
      status((filesystem *)&local_158,(path *)local_40,(error_code *)&fs);
      bVar1 = std::error_code::operator_cast_to_bool((error_code *)&fs);
      if ((bVar1) && (fVar2 = file_status::type(&local_158), fVar2 != not_found)) {
        *(file_status *)current._path.field_2._8_8_ = fs;
        *(undefined8 *)(current._path.field_2._8_8_ + 8) = tec._0_8_;
        p_local._7_1_ = 0;
        part.field_2._12_4_ = 1;
      }
      else {
        file_status::file_status((file_status *)&tmp_ec._M_cat,&local_158);
        bVar1 = exists((file_status *)&tmp_ec._M_cat);
        file_status::~file_status((file_status *)&tmp_ec._M_cat);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          file_status::file_status(&local_178,&local_158);
          bVar1 = is_directory(&local_178);
          file_status::~file_status(&local_178);
          if (((bVar1 ^ 0xffU) & 1) != 0) {
            eVar3 = detail::make_error_code(exists);
            *(ulong *)current._path.field_2._8_8_ = CONCAT44(uStack_184,eVar3._M_value);
            *(error_category **)(current._path.field_2._8_8_ + 8) = eVar3._M_cat;
            p_local._7_1_ = 0;
            part.field_2._12_4_ = 1;
            goto LAB_001a9bc6;
          }
        }
        else {
          create_directory((path *)local_40,(error_code *)current._path.field_2._8_8_);
          bVar1 = std::error_code::operator_cast_to_bool((error_code *)current._path.field_2._8_8_);
          if (bVar1) {
            std::error_code::error_code((error_code *)local_170);
            bVar1 = is_directory((path *)local_40,(error_code *)local_170);
            if (!bVar1) {
              p_local._7_1_ = 0;
              part.field_2._12_4_ = 1;
              goto LAB_001a9bc6;
            }
            std::error_code::clear((error_code *)current._path.field_2._8_8_);
          }
          __range2._7_1_ = 1;
        }
        part.field_2._12_4_ = 0;
      }
LAB_001a9bc6:
      file_status::~file_status(&local_158);
      if (part.field_2._12_4_ == 0) goto LAB_001a9be0;
    }
    std::__cxx11::string::~string((string *)local_f8);
    if (part.field_2._12_4_ != 0) goto LAB_001a9c17;
    path::iterator::operator++((iterator *)((long)&__end2._current._path.field_2 + 8));
  }
  part.field_2._12_4_ = 2;
LAB_001a9c17:
  path::iterator::~iterator((iterator *)local_d0);
  path::iterator::~iterator((iterator *)((long)&__end2._current._path.field_2 + 8));
  if (part.field_2._12_4_ == 2) {
    p_local._7_1_ = __range2._7_1_;
    part.field_2._12_4_ = 1;
  }
  path::~path((path *)local_40);
  return (bool)(p_local._7_1_ & 1);
}

Assistant:

GHC_INLINE bool create_directories(const path& p, std::error_code& ec) noexcept
{
    path current;
    ec.clear();
    bool didCreate = false;
    for (path::string_type part : p) {
        current /= part;
        if (current != p.root_name() && current != p.root_path()) {
            std::error_code tec;
            auto fs = status(current, tec);
            if (tec && fs.type() != file_type::not_found) {
                ec = tec;
                return false;
            }
            if (!exists(fs)) {
                create_directory(current, ec);
                if (ec) {
                    std::error_code tmp_ec;
                    if (is_directory(current, tmp_ec)) {
                        ec.clear();
                    } else {
                        return false;
                    }
                }
                didCreate = true;
            }
#ifndef LWG_2935_BEHAVIOUR
            else if (!is_directory(fs)) {
                ec = detail::make_error_code(detail::portable_error::exists);
                return false;
            }
#endif
        }
    }
    return didCreate;
}